

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.cpp
# Opt level: O2

void __thiscall DObject::SerializeUserVars(DObject *this,FSerializer *arc)

{
  FWriter *pFVar1;
  PClass *this_00;
  
  pFVar1 = arc->w;
  this_00 = GetClass(this);
  if (pFVar1 != (FWriter *)0x0) {
    PClass::WriteAllFields(this_00,arc,this);
    return;
  }
  PClass::ReadAllFields(this_00,arc,this);
  return;
}

Assistant:

void DObject::SerializeUserVars(FSerializer &arc)
{
	if (arc.isWriting())
	{
		// Write all fields that aren't serialized by native code.
		GetClass()->WriteAllFields(arc, this);
	}
	else
	{
		GetClass()->ReadAllFields(arc, this);
	}
}